

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

uint pugi::impl::anon_unknown_0::string_to_integer<unsigned_int>(char_t *value,uint minv,uint maxv)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  char_t *s;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  
  lVar6 = 0;
  do {
    lVar5 = lVar6;
    bVar2 = value[lVar5];
    lVar6 = lVar5 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar2] & 8) != 0);
  uVar7 = (ulong)((bVar2 - 0x2b & 0xfd) == 0);
  if ((value[lVar5 + uVar7] == '0') && ((value[lVar6 + uVar7] & 0xdfU) == 0x58)) {
    pcVar9 = value + lVar6 + uVar7;
    do {
      pcVar10 = pcVar9 + 1;
      pcVar9 = pcVar9 + 1;
    } while (*pcVar10 == '0');
    uVar7 = 0;
    uVar4 = 0;
    do {
      uVar8 = (int)*pcVar9 - 0x30;
      if (uVar8 < 10) {
        uVar4 = uVar4 << 4 | uVar8;
      }
      else {
        uVar8 = (int)*pcVar9 | 0x20;
        if (5 < uVar8 - 0x61) goto LAB_00188637;
        uVar4 = (uVar4 * 0x10 + uVar8) - 0x57;
      }
      pcVar9 = pcVar9 + 1;
      uVar7 = uVar7 + 1;
    } while( true );
  }
  pcVar9 = (char *)(uVar7 + lVar6);
  do {
    pcVar10 = pcVar9;
    cVar3 = value[(long)(pcVar10 + -1)];
    pcVar9 = pcVar10 + 1;
  } while (cVar3 == '0');
  pcVar10 = value + (long)(pcVar10 + -1);
  uVar8 = (int)*pcVar10 - 0x30;
  uVar4 = 0;
  if (uVar8 < 10) {
    uVar4 = 0;
    do {
      uVar4 = uVar8 + uVar4 * 10;
      pcVar1 = pcVar10 + 1;
      pcVar10 = pcVar10 + 1;
      uVar8 = (int)*pcVar1 - 0x30;
    } while (uVar8 < 10);
  }
  if ((char *)0x9 < pcVar10 + (-(long)pcVar9 - (long)value) + 2) {
    bVar11 = true;
    if (pcVar10 + (-8 - (long)value) != pcVar9) goto LAB_0018864e;
    if ('3' < cVar3) {
      bVar11 = -1 < (int)uVar4 || cVar3 != '4';
      goto LAB_0018864e;
    }
  }
  bVar11 = false;
LAB_0018864e:
  if (bVar2 == 0x2d) {
    uVar8 = -uVar4;
    if (-minv < uVar4) {
      uVar8 = minv;
    }
    if (bVar11) {
      uVar8 = minv;
    }
    return uVar8;
  }
  if (maxv <= uVar4) {
    uVar4 = maxv;
  }
  if (bVar11) {
    uVar4 = maxv;
  }
  return uVar4;
LAB_00188637:
  bVar11 = 8 < uVar7;
  goto LAB_0018864e;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}